

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

shared_ptr<duckdb::BoundParameterData,_true> __thiscall
duckdb::BoundParameterData::Deserialize(BoundParameterData *this,Deserializer *deserializer)

{
  BoundParameterData *pBVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BoundParameterData,_true> sVar2;
  Value local_a0;
  Value value;
  
  Deserializer::ReadProperty<duckdb::Value>(&value,deserializer,100,"value");
  pBVar1 = (BoundParameterData *)operator_new(0x58);
  Value::Value(&local_a0,&value);
  BoundParameterData(pBVar1,&local_a0);
  ::std::__shared_ptr<duckdb::BoundParameterData,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::BoundParameterData,void>
            ((__shared_ptr<duckdb::BoundParameterData,(__gnu_cxx::_Lock_policy)2> *)this,pBVar1);
  Value::~Value(&local_a0);
  pBVar1 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                     ((shared_ptr<duckdb::BoundParameterData,_true> *)this);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,0x65,"return_type",&pBVar1->return_type);
  Value::~Value(&value);
  sVar2.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::BoundParameterData,_true>)
         sVar2.internal.super___shared_ptr<duckdb::BoundParameterData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BoundParameterData> BoundParameterData::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadProperty<Value>(100, "value");
	auto result = duckdb::shared_ptr<BoundParameterData>(new BoundParameterData(value));
	deserializer.ReadProperty<LogicalType>(101, "return_type", result->return_type);
	return result;
}